

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O2

int equal_frequency(frequency_t *a,frequency_t *b)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(a->trip_id,b->trip_id);
  uVar2 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->start_time,b->start_time);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->end_time,b->end_time);
      if ((iVar1 == 0) && (uVar2 = 0, a->headway_secs == b->headway_secs)) {
        uVar2 = (uint)(a->exact_times == b->exact_times);
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_frequency(const frequency_t *a, const frequency_t *b) {
    return (!strcmp(a->trip_id, b->trip_id) &&
             !strcmp(a->start_time, b->start_time) &&
             !strcmp(a->end_time, b->end_time) &&
             a->headway_secs == b->headway_secs &&
             a->exact_times == b->exact_times);
}